

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_hash.cc
# Opt level: O1

uint64_t absl::lts_20250127::hash_internal::LowLevelHash
                   (void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  uint64_t uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong *puVar29;
  
  if (0x10 < len) {
    uVar25 = seed ^ *salt;
    uVar23 = len;
    puVar29 = (ulong *)data;
    if (0x40 < len) {
      uVar26 = uVar25;
      uVar27 = uVar25;
      uVar28 = uVar25;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *puVar29 ^ salt[1];
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar26 ^ puVar29[1];
        uVar26 = SUB168(auVar5 * auVar14,8) ^ SUB168(auVar5 * auVar14,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = puVar29[2] ^ salt[2];
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar27 ^ puVar29[3];
        uVar27 = SUB168(auVar6 * auVar15,8) ^ SUB168(auVar6 * auVar15,0);
        puVar1 = puVar29 + 4;
        puVar2 = puVar29 + 5;
        puVar3 = puVar29 + 6;
        puVar4 = puVar29 + 7;
        puVar29 = puVar29 + 8;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *puVar1 ^ salt[3];
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar28 ^ *puVar2;
        uVar28 = SUB168(auVar7 * auVar16,8) ^ SUB168(auVar7 * auVar16,0);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *puVar3 ^ salt[4];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar25 ^ *puVar4;
        uVar25 = SUB168(auVar8 * auVar17,8) ^ SUB168(auVar8 * auVar17,0);
        uVar23 = uVar23 - 0x40;
      } while (0x40 < uVar23);
      uVar25 = uVar25 + uVar28 ^ uVar26 ^ uVar27;
    }
    if (0x20 < uVar23) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = salt[1] ^ *puVar29;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = puVar29[1] ^ uVar25;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = salt[2] ^ puVar29[2];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar25 ^ puVar29[3];
      uVar25 = SUB168(auVar10 * auVar19,8) ^ SUB168(auVar9 * auVar18,8) ^ SUB168(auVar9 * auVar18,0)
               ^ SUB168(auVar10 * auVar19,0);
      puVar29 = puVar29 + 4;
      uVar23 = uVar23 - 0x20;
    }
    if (0x10 < uVar23) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = salt[1] ^ *puVar29;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar25 ^ puVar29[1];
      uVar25 = SUB168(auVar11 * auVar20,8) ^ SUB168(auVar11 * auVar20,0);
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)((long)data + (len - 0x10)) ^ salt[1] ^ len;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar25 ^ *(ulong *)((long)data + (len - 8));
    return SUB168(auVar12 * auVar21,0) ^ SUB168(auVar12 * auVar21,8);
  }
  uVar24 = seed ^ *salt;
  if (len != 0) {
    if (len < 9) {
      if (len < 4) {
        uVar23 = (ulong)CONCAT11(*data,*(undefined1 *)((long)data + (len - 1)));
        uVar25 = (ulong)*(byte *)((long)data + (len >> 1));
      }
      else {
        uVar23 = (ulong)*data;
        uVar25 = (ulong)*(uint *)((long)data + (len - 4));
      }
    }
    else {
      uVar23 = *data;
      uVar25 = *(ulong *)((long)data + (len - 8));
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar23 ^ salt[1] ^ len;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar25 ^ uVar24;
    uVar24 = SUB168(auVar13 * auVar22,8) ^ SUB168(auVar13 * auVar22,0);
  }
  return uVar24;
}

Assistant:

uint64_t LowLevelHash(const void* data, size_t len, uint64_t seed,
                      const uint64_t salt[5]) {
  if (len > 16) return LowLevelHashLenGt16(data, len, seed, salt);

  // Prefetch the cacheline that data resides in.
  PrefetchToLocalCache(data);
  const uint8_t* ptr = static_cast<const uint8_t*>(data);
  uint64_t starting_length = static_cast<uint64_t>(len);
  uint64_t current_state = seed ^ salt[0];
  if (len == 0) return current_state;

  uint64_t a = 0;
  uint64_t b = 0;

  // We now have a data `ptr` with at least 1 and at most 16 bytes.
  if (len > 8) {
    // When we have at least 9 and at most 16 bytes, set A to the first 64
    // bits of the input and B to the last 64 bits of the input. Yes, they
    // will overlap in the middle if we are working with less than the full 16
    // bytes.
    a = absl::base_internal::UnalignedLoad64(ptr);
    b = absl::base_internal::UnalignedLoad64(ptr + len - 8);
  } else if (len > 3) {
    // If we have at least 4 and at most 8 bytes, set A to the first 32
    // bits and B to the last 32 bits.
    a = absl::base_internal::UnalignedLoad32(ptr);
    b = absl::base_internal::UnalignedLoad32(ptr + len - 4);
  } else {
    // If we have at least 1 and at most 3 bytes, read 2 bytes into A and the
    // other byte into B, with some adjustments.
    a = static_cast<uint64_t>((ptr[0] << 8) | ptr[len - 1]);
    b = static_cast<uint64_t>(ptr[len >> 1]);
  }

  return Mix(a ^ salt[1] ^ starting_length, b ^ current_state);
}